

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ali_string_utils.cpp
# Opt level: O0

string * get_format_string_abi_cxx11_(string *__return_storage_ptr__,char *format,...)

{
  char in_AL;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_1128 [16];
  undefined8 local_1118;
  undefined8 local_1110;
  undefined8 local_1108;
  undefined8 local_1100;
  undefined8 local_10f8;
  undefined8 local_10e8;
  undefined8 local_10d8;
  undefined8 local_10c8;
  undefined8 local_10b8;
  undefined8 local_10a8;
  undefined8 local_1098;
  undefined8 local_1088;
  int local_105c;
  undefined4 local_1058;
  int len;
  va_list ap;
  int local_1034;
  char *pcStack_1030;
  int cur_buf_len;
  char *backup_buf;
  char buf [4096];
  char *format_local;
  string *res;
  
  if (in_AL != '\0') {
    local_10f8 = in_XMM0_Qa;
    local_10e8 = in_XMM1_Qa;
    local_10d8 = in_XMM2_Qa;
    local_10c8 = in_XMM3_Qa;
    local_10b8 = in_XMM4_Qa;
    local_10a8 = in_XMM5_Qa;
    local_1098 = in_XMM6_Qa;
    local_1088 = in_XMM7_Qa;
  }
  local_1118 = in_RDX;
  local_1110 = in_RCX;
  local_1108 = in_R8;
  local_1100 = in_R9;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  memset(&backup_buf,0,0x1000);
  pcStack_1030 = (char *)0x0;
  local_1034 = 0x1000;
  ap[0].overflow_arg_area = local_1128;
  ap[0]._0_8_ = &stack0x00000008;
  len = 0x30;
  local_1058 = 0x10;
  local_105c = vsnprintf((char *)&backup_buf,0x1000,format,&local_1058);
  while (local_1034 <= local_105c) {
    local_1034 = local_1034 << 1;
    if (pcStack_1030 != (char *)0x0) {
      free(pcStack_1030);
    }
    pcStack_1030 = (char *)calloc(1,(long)local_1034);
    ap[0].overflow_arg_area = local_1128;
    ap[0]._0_8_ = &stack0x00000008;
    len = 0x30;
    local_1058 = 0x10;
    local_105c = vsnprintf(pcStack_1030,(long)local_1034,format,&local_1058);
  }
  if (pcStack_1030 == (char *)0x0) {
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(char *)&backup_buf);
  }
  else {
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,pcStack_1030);
    free(pcStack_1030);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string get_format_string(const char * format, ...) {
  std::string res;
  char buf[4096] = {};
  char* backup_buf = NULL;
  int cur_buf_len = sizeof(buf);
  va_list ap;
  va_start(ap, format);
  int len = vsnprintf(buf, cur_buf_len, format, ap);
  va_end(ap);
  while(len >= cur_buf_len) {
    cur_buf_len *= 2;
    if(backup_buf) {
      free(backup_buf);
    }

    backup_buf = (char*)calloc(1, cur_buf_len);
    va_start(ap, format);
    len = vsnprintf(backup_buf, cur_buf_len, format, ap);
    va_end(ap);
  }
  

  if(backup_buf) {
    res =backup_buf;
    free(backup_buf);
  } else {
    res = buf;
  }
  return res;
}